

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

void * rw::copyHAnim(void *dst,void *src,int32 offset,int32 param_4)

{
  uint *puVar1;
  undefined4 *puVar2;
  HAnimHierarchy *pHVar3;
  HAnimHierarchy *dsthier;
  HAnimHierarchy *srchier;
  HAnimData *srchanim;
  HAnimData *dsthanim;
  int i;
  int32 param_3_local;
  int32 offset_local;
  void *src_local;
  void *dst_local;
  
  puVar2 = (undefined4 *)((long)dst + (long)offset);
  *puVar2 = *(undefined4 *)((long)src + (long)offset);
  *(undefined8 *)(puVar2 + 2) = 0;
  puVar1 = *(uint **)((undefined4 *)((long)src + (long)offset) + 2);
  if ((puVar1 != (uint *)0x0) && ((*puVar1 & 1) == 0)) {
    pHVar3 = HAnimHierarchy::create
                       (puVar1[1],(int32 *)0x0,(int32 *)0x0,*puVar1,
                        *(int32 *)(*(long *)(puVar1 + 0xc) + 0x18));
    for (dsthanim._4_4_ = 0; dsthanim._4_4_ < pHVar3->numNodes; dsthanim._4_4_ = dsthanim._4_4_ + 1)
    {
      pHVar3->nodeInfo[dsthanim._4_4_].frame = (Frame *)0x0;
      pHVar3->nodeInfo[dsthanim._4_4_].flags =
           *(int32 *)(*(long *)(puVar1 + 6) + (long)dsthanim._4_4_ * 0x18 + 8);
      pHVar3->nodeInfo[dsthanim._4_4_].index =
           *(int32 *)(*(long *)(puVar1 + 6) + (long)dsthanim._4_4_ * 0x18 + 4);
      pHVar3->nodeInfo[dsthanim._4_4_].id =
           *(int32 *)(*(long *)(puVar1 + 6) + (long)dsthanim._4_4_ * 0x18);
    }
    *(HAnimHierarchy **)(puVar2 + 2) = pHVar3;
    pHVar3->parentFrame = (Frame *)dst;
  }
  return dst;
}

Assistant:

static void*
copyHAnim(void *dst, void *src, int32 offset, int32)
{
	int i;
	HAnimData *dsthanim = PLUGINOFFSET(HAnimData, dst, offset);
	HAnimData *srchanim = PLUGINOFFSET(HAnimData, src, offset);
	HAnimHierarchy *srchier, *dsthier;
	dsthanim->id = srchanim->id;
	dsthanim->hierarchy = nil;
	srchier = srchanim->hierarchy;
	if(srchier && !(srchier->flags & HAnimHierarchy::SUBHIERARCHY)){
		dsthier = HAnimHierarchy::create(srchier->numNodes, nil, nil, srchier->flags, srchier->interpolator->maxInterpKeyFrameSize);
		for(i = 0; i < dsthier->numNodes; i++){
			dsthier->nodeInfo[i].frame = nil;
			dsthier->nodeInfo[i].flags = srchier->nodeInfo[i].flags;
			dsthier->nodeInfo[i].index = srchier->nodeInfo[i].index;
			dsthier->nodeInfo[i].id = srchier->nodeInfo[i].id;
		}
		dsthanim->hierarchy = dsthier;
		dsthier->parentFrame = (Frame*)dst;
	}
	return dst;
}